

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::seekValueGenericJoin
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel,bool firstFactor)

{
  size_t off;
  size_t sVar1;
  CppGenerator *pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t off_00;
  string resetMaxVal;
  string depthString;
  string findUpperBound;
  string upperPointer;
  size_t local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  uint local_614;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  string local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::to_string(&local_5f0,depth);
  pCVar2 = (CppGenerator *)rel_name;
  std::__cxx11::string::string((string *)&local_50,(string *)rel_name);
  local_614 = (uint)parallel;
  getUpperPointer(&local_110,pCVar2,&local_50,depth,parallel);
  std::__cxx11::string::~string((string *)&local_50);
  off_00 = depth + 5;
  offset_abi_cxx11_(&local_798,this,off_00);
  std::operator+(&local_778,&local_798,"leap = 1;\n");
  offset_abi_cxx11_(&local_7b8,this,off_00);
  std::operator+(&local_758,&local_778,&local_7b8);
  std::operator+(&local_738,&local_758,"high = lowerptr_");
  std::operator+(&local_718,&local_738,rel_name);
  std::operator+(&local_6f8,&local_718,"[");
  std::operator+(&local_6d8,&local_6f8,&local_5f0);
  std::operator+(&local_6b8,&local_6d8,"];\n");
  offset_abi_cxx11_(&local_7d8,this,off_00);
  std::operator+(&local_698,&local_6b8,&local_7d8);
  std::operator+(&local_678,&local_698,"while (high <= ");
  std::operator+(&local_658,&local_678,&local_110);
  std::operator+(&local_638,&local_658," && ");
  std::operator+(&local_9d8,&local_638,rel_name);
  std::operator+(&local_9b8,&local_9d8,"[high].");
  std::operator+(&local_998,&local_9b8,attr_name);
  std::operator+(&local_978,&local_998," < max_");
  std::operator+(&local_958,&local_978,attr_name);
  std::operator+(&local_938,&local_958,")\n");
  offset_abi_cxx11_(&local_7f8,this,off_00);
  std::operator+(&local_918,&local_938,&local_7f8);
  std::operator+(&local_8f8,&local_918,"{\n");
  off = depth + 6;
  offset_abi_cxx11_(&local_818,this,off);
  std::operator+(&local_8d8,&local_8f8,&local_818);
  std::operator+(&local_8b8,&local_8d8,"high += leap;\n");
  offset_abi_cxx11_(&local_838,this,off);
  std::operator+(&local_898,&local_8b8,&local_838);
  std::operator+(&local_878,&local_898,"leap *= 2;\n");
  offset_abi_cxx11_(&local_858,this,off_00);
  std::operator+(&local_610,&local_878,&local_858);
  std::operator+(&local_130,&local_610,"}\n");
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_798);
  offset_abi_cxx11_(&local_2b0,this,off_00);
  std::operator+(&local_290,&local_2b0,"/* Backtrack with binary search */\n");
  offset_abi_cxx11_(&local_2d0,this,off_00);
  std::operator+(&local_270,&local_290,&local_2d0);
  std::operator+(&local_250,&local_270,"leap /= 2;\n");
  offset_abi_cxx11_(&local_2f0,this,off_00);
  std::operator+(&local_230,&local_250,&local_2f0);
  std::operator+(&local_210,&local_230,"high = std::min(high,");
  std::operator+(&local_1f0,&local_210,&local_110);
  std::operator+(&local_1d0,&local_1f0,");\n");
  offset_abi_cxx11_(&local_310,this,off_00);
  std::operator+(&local_1b0,&local_1d0,&local_310);
  std::operator+(&local_190,&local_1b0,"low = high - leap; mid = 0;\n");
  offset_abi_cxx11_(&local_330,this,off_00);
  std::operator+(&local_170,&local_190,&local_330);
  std::operator+(&local_150,&local_170,"while (low <= high)\n");
  offset_abi_cxx11_(&local_350,this,off_00);
  std::operator+(&local_5d0,&local_150,&local_350);
  std::operator+(&local_5b0,&local_5d0,"{\n");
  offset_abi_cxx11_(&local_370,this,off);
  std::operator+(&local_590,&local_5b0,&local_370);
  std::operator+(&local_570,&local_590,"mid = (high + low) / 2;\n");
  offset_abi_cxx11_(&local_390,this,off);
  std::operator+(&local_550,&local_570,&local_390);
  std::operator+(&local_530,&local_550,"if (max_");
  std::operator+(&local_510,&local_530,attr_name);
  std::operator+(&local_4f0,&local_510," < ");
  std::operator+(&local_4d0,&local_4f0,rel_name);
  std::operator+(&local_858,&local_4d0,"[mid].");
  std::operator+(&local_838,&local_858,attr_name);
  std::operator+(&local_818,&local_838,")\n");
  sVar1 = depth + 7;
  offset_abi_cxx11_(&local_3b0,this,sVar1);
  std::operator+(&local_7f8,&local_818,&local_3b0);
  std::operator+(&local_7d8,&local_7f8,"high = mid - 1;\n");
  offset_abi_cxx11_(&local_3d0,this,off);
  std::operator+(&local_7b8,&local_7d8,&local_3d0);
  std::operator+(&local_798,&local_7b8,"else if(max_");
  std::operator+(&local_778,&local_798,attr_name);
  std::operator+(&local_758,&local_778," > ");
  std::operator+(&local_738,&local_758,rel_name);
  std::operator+(&local_718,&local_738,"[mid].");
  std::operator+(&local_6f8,&local_718,attr_name);
  std::operator+(&local_6d8,&local_6f8,")\n");
  offset_abi_cxx11_(&local_3f0,this,sVar1);
  std::operator+(&local_6b8,&local_6d8,&local_3f0);
  std::operator+(&local_698,&local_6b8,"low = mid + 1;\n");
  offset_abi_cxx11_(&local_410,this,off);
  std::operator+(&local_678,&local_698,&local_410);
  std::operator+(&local_658,&local_678,"else if  (low != mid)\n");
  offset_abi_cxx11_(&local_430,this,sVar1);
  std::operator+(&local_638,&local_658,&local_430);
  std::operator+(&local_9d8,&local_638,"high = mid;\n");
  offset_abi_cxx11_(&local_450,this,off);
  std::operator+(&local_9b8,&local_9d8,&local_450);
  std::operator+(&local_998,&local_9b8,"else\n");
  offset_abi_cxx11_(&local_470,this,sVar1);
  std::operator+(&local_978,&local_998,&local_470);
  std::operator+(&local_958,&local_978,"break;\n");
  offset_abi_cxx11_(&local_490,this,off_00);
  std::operator+(&local_938,&local_958,&local_490);
  std::operator+(&local_918,&local_938,"}\n");
  offset_abi_cxx11_(&local_4b0,this,off_00);
  std::operator+(&local_8f8,&local_918,&local_4b0);
  std::operator+(&local_8d8,&local_8f8,"lowerptr_");
  std::operator+(&local_8b8,&local_8d8,rel_name);
  std::operator+(&local_898,&local_8b8,"[");
  std::operator+(&local_878,&local_898,&local_5f0);
  std::operator+(&local_610,&local_878,"] = mid;\n");
  std::__cxx11::string::append((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_610,"",(allocator *)&local_878);
  if (firstFactor) {
    offset_abi_cxx11_(&local_9d8,this,depth + 4);
    std::operator+(&local_9b8,&local_9d8,"max_");
    std::operator+(&local_998,&local_9b8,attr_name);
    std::operator+(&local_978,&local_998," = ");
    std::operator+(&local_958,&local_978,rel_name);
    std::operator+(&local_938,&local_958,"[lowerptr_");
    std::operator+(&local_918,&local_938,rel_name);
    std::operator+(&local_8f8,&local_918,"[");
    std::operator+(&local_8d8,&local_8f8,&local_5f0);
    std::operator+(&local_8b8,&local_8d8,"]].");
    std::operator+(&local_898,&local_8b8,attr_name);
    std::operator+(&local_878,&local_898,";\n");
    std::__cxx11::string::operator=((string *)&local_610,(string *)&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::__cxx11::string::~string((string *)&local_918);
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_978);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)&local_9b8);
    this_00 = &local_9d8;
  }
  else {
    sVar1 = depth + 4;
    offset_abi_cxx11_(&local_530,this,sVar1);
    std::operator+(&local_510,&local_530,"if (max_");
    std::operator+(&local_4f0,&local_510,attr_name);
    std::operator+(&local_4d0,&local_4f0," < ");
    std::operator+(&local_858,&local_4d0,rel_name);
    std::operator+(&local_838,&local_858,"[lowerptr_");
    std::operator+(&local_818,&local_838,rel_name);
    std::operator+(&local_7f8,&local_818,"[");
    std::operator+(&local_7d8,&local_7f8,&local_5f0);
    std::operator+(&local_7b8,&local_7d8,"]].");
    std::operator+(&local_798,&local_7b8,attr_name);
    std::operator+(&local_778,&local_798,")\n");
    offset_abi_cxx11_(&local_550,this,sVar1);
    std::operator+(&local_758,&local_778,&local_550);
    std::operator+(&local_738,&local_758,"{\n");
    offset_abi_cxx11_(&local_570,this,off_00);
    std::operator+(&local_718,&local_738,&local_570);
    std::operator+(&local_6f8,&local_718,"max_");
    std::operator+(&local_6d8,&local_6f8,attr_name);
    std::operator+(&local_6b8,&local_6d8," = ");
    std::operator+(&local_698,&local_6b8,rel_name);
    std::operator+(&local_678,&local_698,"[lowerptr_");
    std::operator+(&local_658,&local_678,rel_name);
    std::operator+(&local_638,&local_658,"[");
    std::operator+(&local_9d8,&local_638,&local_5f0);
    std::operator+(&local_9b8,&local_9d8,"]].");
    std::operator+(&local_998,&local_9b8,attr_name);
    std::operator+(&local_978,&local_998,";\n");
    offset_abi_cxx11_(&local_590,this,off_00);
    std::operator+(&local_958,&local_978,&local_590);
    std::operator+(&local_938,&local_958,"found[");
    std::operator+(&local_918,&local_938,&local_5f0);
    std::operator+(&local_8f8,&local_918,"] = false;\n");
    offset_abi_cxx11_(&local_5b0,this,off_00);
    std::operator+(&local_8d8,&local_8f8,&local_5b0);
    std::operator+(&local_8b8,&local_8d8,"continue;\n");
    offset_abi_cxx11_(&local_5d0,this,sVar1);
    std::operator+(&local_898,&local_8b8,&local_5d0);
    std::operator+(&local_878,&local_898,"}\n");
    std::__cxx11::string::operator=((string *)&local_610,(string *)&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::__cxx11::string::~string((string *)&local_918);
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::~string((string *)&local_978);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)&local_678);
    std::__cxx11::string::~string((string *)&local_698);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&local_798);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_818);
    std::__cxx11::string::~string((string *)&local_838);
    std::__cxx11::string::~string((string *)&local_858);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    this_00 = &local_530;
  }
  local_9f0 = depth + 4;
  std::__cxx11::string::~string((string *)this_00);
  offset_abi_cxx11_(&local_3f0,this,local_9f0);
  std::operator+(&local_3d0,&local_3f0,"if(max_");
  std::operator+(&local_3b0,&local_3d0,attr_name);
  std::operator+(&local_390,&local_3b0," > ");
  std::operator+(&local_370,&local_390,rel_name);
  std::operator+(&local_350,&local_370,"[");
  pCVar2 = (CppGenerator *)rel_name;
  std::__cxx11::string::string((string *)&local_70,(string *)rel_name);
  getUpperPointer(&local_410,pCVar2,&local_70,depth,SUB41(local_614,0));
  std::operator+(&local_330,&local_350,&local_410);
  std::operator+(&local_310,&local_330,"].");
  std::operator+(&local_2f0,&local_310,attr_name);
  std::operator+(&local_2d0,&local_2f0,")\n");
  offset_abi_cxx11_(&local_430,this,local_9f0);
  std::operator+(&local_2b0,&local_2d0,&local_430);
  std::operator+(&local_290,&local_2b0,"{\n");
  offset_abi_cxx11_(&local_450,this,off_00);
  std::operator+(&local_270,&local_290,&local_450);
  std::operator+(&local_250,&local_270,"atEnd[");
  std::operator+(&local_230,&local_250,&local_5f0);
  std::operator+(&local_210,&local_230,"] = true;\n");
  offset_abi_cxx11_(&local_470,this,off_00);
  std::operator+(&local_1f0,&local_210,&local_470);
  std::operator+(&local_1d0,&local_1f0,"break;\n");
  offset_abi_cxx11_(&local_490,this,local_9f0);
  std::operator+(&local_1b0,&local_1d0,&local_490);
  std::operator+(&local_190,&local_1b0,"}\n");
  offset_abi_cxx11_(&local_4b0,this,local_9f0);
  std::operator+(&local_170,&local_190,&local_4b0);
  std::operator+(&local_150,&local_170,"else if (max_");
  std::operator+(&local_5d0,&local_150,attr_name);
  std::operator+(&local_5b0,&local_5d0," > ");
  std::operator+(&local_590,&local_5b0,rel_name);
  std::operator+(&local_570,&local_590,"[lowerptr_");
  std::operator+(&local_550,&local_570,rel_name);
  std::operator+(&local_530,&local_550,"[");
  std::operator+(&local_510,&local_530,&local_5f0);
  std::operator+(&local_4f0,&local_510,"]].");
  std::operator+(&local_4d0,&local_4f0,attr_name);
  std::operator+(&local_858,&local_4d0,")\n");
  offset_abi_cxx11_(&local_90,this,local_9f0);
  std::operator+(&local_838,&local_858,&local_90);
  std::operator+(&local_818,&local_838,"{\n");
  std::operator+(&local_7f8,&local_818,&local_130);
  offset_abi_cxx11_(&local_b0,this,off_00);
  std::operator+(&local_7d8,&local_7f8,&local_b0);
  std::operator+(&local_7b8,&local_7d8,"if (max_");
  std::operator+(&local_798,&local_7b8,attr_name);
  std::operator+(&local_778,&local_798," > ");
  std::operator+(&local_758,&local_778,rel_name);
  std::operator+(&local_738,&local_758,"[lowerptr_");
  std::operator+(&local_718,&local_738,rel_name);
  std::operator+(&local_6f8,&local_718,"[");
  std::operator+(&local_6d8,&local_6f8,&local_5f0);
  std::operator+(&local_6b8,&local_6d8,"]].");
  std::operator+(&local_698,&local_6b8,attr_name);
  std::operator+(&local_678,&local_698,")\n");
  offset_abi_cxx11_(&local_d0,this,off);
  std::operator+(&local_658,&local_678,&local_d0);
  std::operator+(&local_638,&local_658,"std::cout << \"ERROR: max_");
  std::operator+(&local_9d8,&local_638,attr_name);
  std::operator+(&local_9b8,&local_9d8," > ");
  std::operator+(&local_998,&local_9b8,rel_name);
  std::operator+(&local_978,&local_998,"[lowerptr_");
  std::operator+(&local_958,&local_978,rel_name);
  std::operator+(&local_938,&local_958,"[");
  std::operator+(&local_918,&local_938,&local_5f0);
  std::operator+(&local_8f8,&local_918,"]].");
  std::operator+(&local_8d8,&local_8f8,attr_name);
  std::operator+(&local_8b8,&local_8d8,"\\n\";\n");
  offset_abi_cxx11_(&local_f0,this,local_9f0);
  std::operator+(&local_898,&local_8b8,&local_f0);
  std::operator+(&local_878,&local_898,"}\n");
  std::operator+(__return_storage_ptr__,&local_878,&local_610);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_5f0);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::seekValueGenericJoin(
    size_t depth, const std::string& rel_name, const std::string& attr_name,
    bool parallel, bool firstFactor)
{
    const std::string depthString = std::to_string(depth);
    const std::string upperPointer = getUpperPointer(rel_name,depth,parallel);
    
    std::string findUpperBound = 
        offset(5+depth)+"leap = 1;\n"+
        offset(5+depth)+"high = lowerptr_"+rel_name+"["+depthString+"];\n"+
        offset(5+depth)+"while (high <= "+
        upperPointer+" && "+rel_name+"[high]."+attr_name+" < max_"+attr_name+")\n"+
        offset(5+depth)+"{\n"+
        offset(6+depth)+"high += leap;\n"+
        offset(6+depth)+"leap *= 2;\n"+
        offset(5+depth)+"}\n";

    /*
     * When we found an upper bound; to find the least upper bound;
     * use binary search to backtrack.
     */ 
    findUpperBound += offset(5+depth)+"/* Backtrack with binary search */\n"+
        // offset(6+depth)+"if (leap > 2 && max_"+attr_name+" <= "+rel_name+
        // "[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"
        // +offset(6+depth)+"{\n"+
        offset(5+depth)+"leap /= 2;\n"+
        offset(5+depth)+"high = std::min(high,"+upperPointer+");\n"+
        offset(5+depth)+"low = high - leap; mid = 0;\n"+
        offset(5+depth)+"while (low <= high)\n"+
        offset(5+depth)+"{\n"+
        offset(6+depth)+"mid = (high + low) / 2;\n"+
        // offset(8+depth)+"if(max_"+attr_name+" == "+rel_name+"[mid]."+attr_name+")\n"+
        // offset(8+depth)+"{\n"+
        // offset(9+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        // offset(9+depth)+"high = mid - 1;\n"+
        // offset(8+depth)+"}\n"+
        offset(6+depth)+"if (max_"+attr_name+" < "+rel_name+"[mid]."+attr_name+")\n"+
        offset(7+depth)+"high = mid - 1;\n"+
        offset(6+depth)+"else if(max_"+attr_name+" > "+rel_name+"[mid]."+attr_name+")\n"+
        offset(7+depth)+"low = mid + 1;\n"+
        offset(6+depth)+"else if  (low != mid)\n"+offset(7+depth)+"high = mid;\n"+
        offset(6+depth)+"else\n"+offset(7+depth)+"break;\n"+
        offset(5+depth)+"}\n"+
        // offset(7+depth)+"mid = (high + low) / 2;\n"+
        // offset(5+depth)+"if("+rel_name+"[mid-1]."+attr_name+">=max_"+attr_name+")\n"+
        // offset(6+depth)+"std::cout << \"ERROR : "+rel_name+"[mid-1]."+
        // attr_name+" >= max_"+attr_name+"\\n\";\n"+
        // offset(5+depth)+"if("+rel_name+"[mid]."+attr_name+"<max_"+attr_name+")\n"+
        // offset(6+depth)+"std::cout << \"ERROR : "+rel_name+"[mid]."+
        // attr_name+" < max_"+attr_name+"\\n\";\n"+
        offset(5+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n";
        // offset(6+depth)+"}\n";

    std::string resetMaxVal = "";
    if (firstFactor)
    {
        resetMaxVal = offset(4+depth)+"max_"+attr_name+" = "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+";\n";
    }
    else
    {
        resetMaxVal = offset(4+depth)+"if (max_"+attr_name+" < "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"+
            offset(4+depth)+"{\n"+offset(5+depth)+"max_"+attr_name+" = "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+";\n"+
            offset(5+depth)+"found["+depthString+"] = false;\n"+
            offset(5+depth)+"continue;\n"+
            offset(4+depth)+"}\n";
    }
    
    
    return /*offset(4+depth)+"if("+rel_name+"[lowerptr_"+rel_name+"["+
        std::to_string(depth)+"]]."+attr_name+" == max_"+attr_name+")\n"+
        offset(5+depth)+"found["+depthString+"] = true;\n"+*/
        // else if 
        offset(4+depth)+"if(max_"+attr_name+" > "+rel_name+"["+
        getUpperPointer(rel_name, depth, parallel)+"]."+attr_name+")\n"+
        offset(4+depth)+"{\n"+offset(5+depth)+"atEnd["+depthString+"] = true;\n"+
        offset(5+depth)+"break;\n"+offset(4+depth)+"}\n"+
        //else 
        offset(4+depth)+"else if (max_"+attr_name+" > "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"+
        offset(4+depth)+"{\n"+findUpperBound+
        offset(5+depth)+"if (max_"+attr_name+" > "+rel_name+"[lowerptr_"+
        rel_name+"["+depthString+"]]."+attr_name+")\n"+
        offset(6+depth)+"std::cout << \"ERROR: max_"+attr_name+" > "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+"\\n\";\n"+
        offset(4+depth)+"}\n"+
        resetMaxVal;
}